

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O1

void VerticalUnfilter_SSE2(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  uint8_t uVar36;
  uint8_t uVar37;
  uint8_t uVar38;
  uint8_t uVar39;
  uint8_t uVar40;
  uint8_t uVar41;
  uint8_t uVar42;
  uint8_t uVar43;
  uint8_t uVar44;
  uint8_t uVar45;
  uint8_t uVar46;
  uint8_t uVar47;
  uint8_t uVar48;
  uint8_t uVar49;
  uint8_t uVar50;
  uint8_t uVar51;
  uint8_t uVar52;
  uint8_t uVar53;
  uint8_t uVar54;
  uint8_t uVar55;
  uint8_t uVar56;
  uint8_t uVar57;
  uint8_t uVar58;
  uint8_t uVar59;
  uint8_t uVar60;
  uint8_t uVar61;
  uint8_t uVar62;
  uint8_t uVar63;
  uint8_t uVar64;
  uint8_t uVar65;
  ulong uVar66;
  
  if (prev == (uint8_t *)0x0) {
    HorizontalUnfilter_SSE2((uint8_t *)0x0,in,out,width);
    return;
  }
  if ((int)(width & 0xffffffe0U) < 1) {
    uVar66 = 0;
  }
  else {
    uVar66 = 0;
    do {
      puVar1 = in + uVar66;
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      uVar7 = puVar1[4];
      uVar8 = puVar1[5];
      uVar9 = puVar1[6];
      uVar10 = puVar1[7];
      uVar11 = puVar1[8];
      uVar12 = puVar1[9];
      uVar13 = puVar1[10];
      uVar14 = puVar1[0xb];
      uVar15 = puVar1[0xc];
      uVar16 = puVar1[0xd];
      uVar17 = puVar1[0xe];
      uVar18 = puVar1[0xf];
      puVar2 = in + uVar66 + 0x10;
      uVar19 = *puVar2;
      uVar20 = puVar2[1];
      uVar21 = puVar2[2];
      uVar22 = puVar2[3];
      uVar23 = puVar2[4];
      uVar24 = puVar2[5];
      uVar25 = puVar2[6];
      uVar26 = puVar2[7];
      uVar27 = puVar2[8];
      uVar28 = puVar2[9];
      uVar29 = puVar2[10];
      uVar30 = puVar2[0xb];
      uVar31 = puVar2[0xc];
      uVar32 = puVar2[0xd];
      uVar33 = puVar2[0xe];
      uVar34 = puVar2[0xf];
      puVar2 = prev + uVar66;
      uVar35 = puVar2[1];
      uVar36 = puVar2[2];
      uVar37 = puVar2[3];
      uVar38 = puVar2[4];
      uVar39 = puVar2[5];
      uVar40 = puVar2[6];
      uVar41 = puVar2[7];
      uVar42 = puVar2[8];
      uVar43 = puVar2[9];
      uVar44 = puVar2[10];
      uVar45 = puVar2[0xb];
      uVar46 = puVar2[0xc];
      uVar47 = puVar2[0xd];
      uVar48 = puVar2[0xe];
      uVar49 = puVar2[0xf];
      puVar3 = prev + uVar66 + 0x10;
      uVar50 = *puVar3;
      uVar51 = puVar3[1];
      uVar52 = puVar3[2];
      uVar53 = puVar3[3];
      uVar54 = puVar3[4];
      uVar55 = puVar3[5];
      uVar56 = puVar3[6];
      uVar57 = puVar3[7];
      uVar58 = puVar3[8];
      uVar59 = puVar3[9];
      uVar60 = puVar3[10];
      uVar61 = puVar3[0xb];
      uVar62 = puVar3[0xc];
      uVar63 = puVar3[0xd];
      uVar64 = puVar3[0xe];
      uVar65 = puVar3[0xf];
      puVar3 = out + uVar66;
      *puVar3 = *puVar2 + *puVar1;
      puVar3[1] = uVar35 + uVar4;
      puVar3[2] = uVar36 + uVar5;
      puVar3[3] = uVar37 + uVar6;
      puVar3[4] = uVar38 + uVar7;
      puVar3[5] = uVar39 + uVar8;
      puVar3[6] = uVar40 + uVar9;
      puVar3[7] = uVar41 + uVar10;
      puVar3[8] = uVar42 + uVar11;
      puVar3[9] = uVar43 + uVar12;
      puVar3[10] = uVar44 + uVar13;
      puVar3[0xb] = uVar45 + uVar14;
      puVar3[0xc] = uVar46 + uVar15;
      puVar3[0xd] = uVar47 + uVar16;
      puVar3[0xe] = uVar48 + uVar17;
      puVar3[0xf] = uVar49 + uVar18;
      puVar1 = out + uVar66 + 0x10;
      *puVar1 = uVar50 + uVar19;
      puVar1[1] = uVar51 + uVar20;
      puVar1[2] = uVar52 + uVar21;
      puVar1[3] = uVar53 + uVar22;
      puVar1[4] = uVar54 + uVar23;
      puVar1[5] = uVar55 + uVar24;
      puVar1[6] = uVar56 + uVar25;
      puVar1[7] = uVar57 + uVar26;
      puVar1[8] = uVar58 + uVar27;
      puVar1[9] = uVar59 + uVar28;
      puVar1[10] = uVar60 + uVar29;
      puVar1[0xb] = uVar61 + uVar30;
      puVar1[0xc] = uVar62 + uVar31;
      puVar1[0xd] = uVar63 + uVar32;
      puVar1[0xe] = uVar64 + uVar33;
      puVar1[0xf] = uVar65 + uVar34;
      uVar66 = uVar66 + 0x20;
    } while (uVar66 < (width & 0xffffffe0U));
  }
  if ((int)uVar66 < width) {
    uVar66 = uVar66 & 0xffffffff;
    do {
      out[uVar66] = prev[uVar66] + in[uVar66];
      uVar66 = uVar66 + 1;
    } while ((uint)width != uVar66);
  }
  return;
}

Assistant:

static void VerticalUnfilter_SSE2(const uint8_t* prev, const uint8_t* in,
                                  uint8_t* out, int width) {
  if (prev == NULL) {
    HorizontalUnfilter_SSE2(NULL, in, out, width);
  } else {
    int i;
    const int max_pos = width & ~31;
    assert(width >= 0);
    for (i = 0; i < max_pos; i += 32) {
      const __m128i A0 = _mm_loadu_si128((const __m128i*)&in[i +  0]);
      const __m128i A1 = _mm_loadu_si128((const __m128i*)&in[i + 16]);
      const __m128i B0 = _mm_loadu_si128((const __m128i*)&prev[i +  0]);
      const __m128i B1 = _mm_loadu_si128((const __m128i*)&prev[i + 16]);
      const __m128i C0 = _mm_add_epi8(A0, B0);
      const __m128i C1 = _mm_add_epi8(A1, B1);
      _mm_storeu_si128((__m128i*)&out[i +  0], C0);
      _mm_storeu_si128((__m128i*)&out[i + 16], C1);
    }
    for (; i < width; ++i) out[i] = (uint8_t)(in[i] + prev[i]);
  }
}